

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void verifyOrthonormal<Imath_3_2::Matrix33<double>>
               (Matrix33<double> *A,BaseType_conflict3 threshold)

{
  uint __line;
  long lVar1;
  long lVar2;
  double (*padVar3) [3];
  char *__assertion;
  Matrix33<double> prod;
  Matrix33<double> local_60;
  
  Imath_3_2::Matrix33<double>::transposed(A);
  padVar3 = (double (*) [3])&prod;
  Imath_3_2::Matrix33<double>::operator*(A,&local_60);
  lVar1 = 0;
  do {
    if (lVar1 == 3) {
      return;
    }
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      if (lVar1 == lVar2) {
        if (threshold <= ABS(*(double *)((long)prod.x + lVar1 * 0x20) + -1.0)) {
          __assertion = "std::abs (prod[i][j] - 1) < threshold";
          __line = 0x3c;
LAB_0012f881:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,__line,
                        "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix33<double>]"
                       );
        }
      }
      else if (threshold <= ABS((*(double (*) [3])*padVar3)[lVar2])) {
        __assertion = "std::abs (prod[i][j]) < threshold";
        __line = 0x3e;
        goto LAB_0012f881;
      }
    }
    lVar1 = lVar1 + 1;
    padVar3 = padVar3 + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const TM& A, const typename TM::BaseType threshold)
{
    const TM prod = A * A.transposed ();
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < threshold);
            else
                assert (std::abs (prod[i][j]) < threshold);
}